

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDTernary(TranslateToFuzzReader *this)

{
  SIMDTernary *pSVar1;
  Type local_48;
  Expression *local_40;
  Expression *c;
  Expression *local_30;
  Expression *b;
  Expression *local_20;
  Expression *a;
  TranslateToFuzzReader *pTStack_10;
  SIMDTernaryOp op;
  TranslateToFuzzReader *this_local;
  
  a._4_4_ = Bitselect;
  pTStack_10 = this;
  Type::Type((Type *)&b,v128);
  local_20 = make(this,(Type)b);
  Type::Type((Type *)&c,v128);
  local_30 = make(this,(Type)c);
  Type::Type(&local_48,v128);
  local_40 = make(this,local_48);
  pSVar1 = Builder::makeSIMDTernary(&this->builder,a._4_4_,local_20,local_30,local_40);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDTernary() {
  // TODO: Enable qfma/qfms once it is implemented in V8 and the interpreter
  // SIMDTernaryOp op = pick(Bitselect,
  //                         QFMAF32x4,
  //                         QFMSF32x4,
  //                         QFMAF64x2,
  //                         QFMSF64x2);
  SIMDTernaryOp op = Bitselect;
  Expression* a = make(Type::v128);
  Expression* b = make(Type::v128);
  Expression* c = make(Type::v128);
  return builder.makeSIMDTernary(op, a, b, c);
}